

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

opj_bool dwt_decode_v2(opj_tcd_tilecomp_v2_t *tilec,OPJ_UINT32 numres)

{
  int iVar1;
  int iVar2;
  int iVar3;
  opj_bool oVar4;
  OPJ_INT32 *pOVar5;
  int *__src;
  int iVar6;
  int x;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  opj_tcd_resolution_v2_t *poVar15;
  dwt_t v;
  dwt_t h;
  uint local_cc;
  uint local_c4;
  dwt_t local_60;
  dwt_t local_48;
  
  poVar15 = tilec->resolutions;
  uVar12 = 0;
  iVar14 = numres - 1;
  if (iVar14 != 0) {
    pOVar5 = &poVar15[1].y1;
    iVar6 = iVar14;
    do {
      uVar9 = pOVar5[-1] - ((opj_tcd_resolution_v2_t *)(pOVar5 + -3))->x0;
      if (uVar9 < (uint)uVar12) {
        uVar9 = (uint)uVar12;
      }
      uVar11 = *pOVar5 - pOVar5[-2];
      if ((uint)(*pOVar5 - pOVar5[-2]) < uVar9) {
        uVar11 = uVar9;
      }
      uVar12 = (ulong)uVar11;
      pOVar5 = pOVar5 + 0x2c;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    uVar12 = (ulong)uVar11 << 2;
  }
  iVar6 = poVar15->x1;
  iVar3 = poVar15->x0;
  iVar1 = poVar15->y0;
  iVar2 = poVar15->y1;
  x = tilec->x1 - tilec->x0;
  __src = (int *)malloc(uVar12);
  if (__src == (int *)0x0) {
    oVar4 = 0;
  }
  else {
    local_60.mem = __src;
    local_48.mem = __src;
    if (iVar14 != 0) {
      local_cc = iVar2 - iVar1;
      local_c4 = iVar6 - iVar3;
      do {
        pOVar5 = tilec->data;
        local_48.sn = local_c4;
        local_60.sn = local_cc;
        uVar9 = poVar15[1].x1 - poVar15[1].x0;
        iVar6 = uVar9 - local_c4;
        local_48.cas = poVar15[1].x0 % 2;
        uVar11 = poVar15[1].y1 - poVar15[1].y0;
        local_48.dn = iVar6;
        if (uVar11 != 0) {
          lVar7 = (long)local_48.cas;
          iVar3 = -local_48.cas;
          uVar12 = 0;
          uVar13 = 0;
          do {
            if (local_c4 != 0) {
              lVar10 = 0;
              do {
                __src[lVar7 + lVar10 * 2] = pOVar5[uVar12 + lVar10];
                lVar10 = lVar10 + 1;
              } while (local_c4 != (uint)lVar10);
            }
            if (iVar6 != 0) {
              lVar10 = 0;
              do {
                __src[(long)iVar3 + lVar10 * 2 + 1] = pOVar5[(long)(int)local_c4 + uVar12 + lVar10];
                lVar10 = lVar10 + 1;
              } while (iVar6 != (int)lVar10);
            }
            dwt_decode_1(&local_48);
            memcpy(pOVar5 + (uint)(x * (int)uVar13),__src,(ulong)uVar9 * 4);
            uVar13 = uVar13 + 1;
            uVar12 = (ulong)(uint)((int)uVar12 + x);
          } while (uVar13 != uVar11);
        }
        local_60.dn = uVar11 - local_cc;
        local_60.cas = poVar15[1].y0 % 2;
        if (uVar9 != 0) {
          uVar12 = 0;
          do {
            dwt_interleave_v(&local_60,pOVar5 + uVar12,x);
            dwt_decode_1(&local_60);
            if (uVar11 != 0) {
              uVar13 = uVar12 & 0xffffffff;
              uVar8 = 0;
              do {
                pOVar5[uVar13] = __src[uVar8];
                uVar8 = uVar8 + 1;
                uVar13 = (ulong)(uint)((int)uVar13 + x);
              } while (uVar11 != uVar8);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar9);
        }
        poVar15 = poVar15 + 1;
        iVar14 = iVar14 + -1;
        local_cc = uVar11;
        local_c4 = uVar9;
      } while (iVar14 != 0);
    }
    free(__src);
    oVar4 = 1;
  }
  return oVar4;
}

Assistant:

opj_bool dwt_decode_v2(opj_tcd_tilecomp_v2_t* tilec, OPJ_UINT32 numres) {
	return dwt_decode_tile_v2(tilec, numres, &dwt_decode_1);
}